

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBarsH<signed_char>
               (char *label_id,char *xs,char *ys,int count,double height,int offset,int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<signed_char> getter;
  int stride_local;
  int offset_local;
  double height_local;
  int count_local;
  char *ys_local;
  char *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<signed_char>::GetterXsYs((GetterXsYs<signed_char> *)local_58,xs,ys,count,offset,stride)
  ;
  PlotBarsHEx<ImPlot::GetterXsYs<signed_char>,double>
            (label_id,(GetterXsYs<signed_char> *)local_58,height);
  return;
}

Assistant:

void PlotBarsH(const char* label_id, const T* xs, const T* ys, int count, double height, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsHEx(label_id, getter, height);
}